

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ClipLayerParams::MergePartialFromCodedStream
          (ClipLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  bool bVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  undefined8 in_RAX;
  ulong uVar8;
  float fVar9;
  undefined8 local_38;
  
  local_38 = in_RAX;
LAB_00142653:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00142676;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00142676:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) != 0) {
      uVar7 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar8 == '\x15') {
          pfVar3 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)((long)&local_38 + 4));
            if (!bVar5) {
              return false;
            }
            fVar9 = local_38._4_4_;
          }
          else {
            fVar9 = *pfVar3;
            input->buffer_ = (uint8 *)(pfVar3 + 1);
          }
          this->maxval_ = fVar9;
          goto LAB_00142653;
        }
      }
      else if ((uVar7 == 1) && ((char)uVar8 == '\r')) {
        pfVar3 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_38);
          if (!bVar5) {
            return false;
          }
          fVar9 = (float)local_38;
        }
        else {
          fVar9 = *pfVar3;
          input->buffer_ = (uint8 *)(pfVar3 + 1);
        }
        this->minval_ = fVar9;
        goto LAB_00142653;
      }
    }
    bVar5 = (uVar6 & 7) == 4 || uVar6 == 0;
    if (bVar5) {
      return bVar5;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    if (!bVar4) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool ClipLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ClipLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float minVal = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &minval_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float maxVal = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &maxval_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ClipLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ClipLayerParams)
  return false;
#undef DO_
}